

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::SpellGroup(Map *this,Character *from,unsigned_short spell_id)

{
  World *pWVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  vector<Character_*,_std::allocator<Character_*>_> *this_00;
  reference ppCVar7;
  mapped_type *pmVar8;
  int *piVar9;
  reference ppCVar10;
  reference ppCVar11;
  byte local_252;
  byte local_235;
  byte local_234;
  byte local_232;
  byte local_1fa;
  byte local_1db;
  byte local_1da;
  byte local_1d9;
  Character *character_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> *__range1_1;
  Character *local_1a0;
  Character *character;
  iterator __end2;
  iterator __begin2;
  list<Character_*,_std::allocator<Character_*>_> *__range2;
  int local_178;
  allocator<char> local_171;
  key_type local_170;
  int local_150;
  byte local_14b;
  byte local_14a;
  allocator<char> local_149;
  key_type local_148;
  int local_124;
  int local_120;
  allocator<char> local_119;
  key_type local_118;
  int local_f8;
  int local_f4;
  int hpgain;
  int displayhp_1;
  Character *member;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  PacketBuilder builder;
  set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> in_range;
  allocator<char> local_51;
  key_type local_50;
  int local_2c;
  ESF_Data *pEStack_28;
  int displayhp;
  ESF_Data *spell;
  Character *pCStack_18;
  unsigned_short spell_id_local;
  Character *from_local;
  Map *this_local;
  
  spell._6_2_ = spell_id;
  pCStack_18 = from;
  from_local = (Character *)this;
  pEStack_28 = ESF::Get(from->world->esf,(uint)spell_id);
  bVar3 = ESF_Data_Base::operator_cast_to_bool((ESF_Data_Base *)pEStack_28);
  if ((((bVar3) && (pEStack_28->type == Heal)) && (pCStack_18->party != (Party *)0x0)) &&
     ((int)pEStack_28->tp <= pCStack_18->tp)) {
    pCStack_18->tp = pCStack_18->tp - (int)pEStack_28->tp;
    local_2c = (int)pEStack_28->hp;
    bVar4 = Character::CanInteractCombat(pCStack_18);
    bVar2 = false;
    bVar3 = false;
    local_1d9 = 0;
    if (!bVar4) {
      bVar4 = Character::CanInteractPKCombat(pCStack_18);
      local_1da = 0;
      if (bVar4) {
        local_1db = 1;
        if ((pCStack_18->map->pk & 1U) == 0) {
          pWVar1 = this->world;
          std::allocator<char>::allocator();
          bVar2 = true;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"GlobalPK",&local_51);
          bVar3 = true;
          pmVar8 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                   ::operator[](&(pWVar1->config).
                                 super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                ,&local_50);
          bVar4 = util::variant::operator_cast_to_bool(pmVar8);
          local_1fa = 0;
          if (bVar4) {
            bVar4 = World::PKExcept(this->world,(int)this->id);
            local_1fa = bVar4 ^ 0xff;
          }
          local_1db = local_1fa;
        }
        local_1da = local_1db;
      }
      local_1d9 = local_1da ^ 0xff;
    }
    if (bVar3) {
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (bVar2) {
      std::allocator<char>::~allocator(&local_51);
    }
    if ((local_1d9 & 1) != 0) {
      in_range._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      piVar9 = std::min<int>(&local_2c,
                             (int *)((long)&in_range._M_t._M_impl.super__Rb_tree_header.
                                            _M_node_count + 4));
      local_2c = *piVar9;
    }
    std::set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_>::set
              ((set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> *)
               &builder.add_size);
    sVar6 = std::vector<Character_*,_std::allocator<Character_*>_>::size
                      (&pCStack_18->party->members);
    PacketBuilder::PacketBuilder
              ((PacketBuilder *)&__range1,PACKET_SPELL,PACKET_TARGET_GROUP,sVar6 * 10 + 8);
    PacketBuilder::AddShort((PacketBuilder *)&__range1,(uint)spell._6_2_);
    iVar5 = Character::PlayerID(pCStack_18);
    PacketBuilder::AddShort((PacketBuilder *)&__range1,iVar5);
    PacketBuilder::AddShort((PacketBuilder *)&__range1,pCStack_18->tp);
    PacketBuilder::AddShort((PacketBuilder *)&__range1,local_2c);
    this_00 = &pCStack_18->party->members;
    __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(this_00);
    member = (Character *)std::vector<Character_*,_std::allocator<Character_*>_>::end(this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                       *)&member), bVar3) {
      ppCVar7 = __gnu_cxx::
                __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                ::operator*(&__end1);
      _hpgain = *ppCVar7;
      if (_hpgain->map == pCStack_18->map) {
        local_f4 = (int)pEStack_28->hp;
        local_f8 = (int)pEStack_28->hp;
        pWVar1 = this->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"LimitDamage",&local_119);
        pmVar8 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar1->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_118);
        bVar3 = util::variant::operator_cast_to_bool(pmVar8);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator(&local_119);
        if (bVar3) {
          local_120 = _hpgain->maxhp - _hpgain->hp;
          piVar9 = std::min<int>(&local_f8,&local_120);
          local_f8 = *piVar9;
        }
        local_124 = 0;
        piVar9 = std::max<int>(&local_f8,&local_124);
        local_f8 = *piVar9;
        local_14a = 0;
        local_14b = 0;
        bVar3 = Character::CanInteractCombat(pCStack_18);
        local_232 = 0;
        if (!bVar3) {
          bVar3 = Character::CanInteractPKCombat(pCStack_18);
          local_234 = 0;
          if (bVar3) {
            local_235 = 1;
            if ((pCStack_18->map->pk & 1U) == 0) {
              pWVar1 = this->world;
              std::allocator<char>::allocator();
              local_14a = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_148,"GlobalPK",&local_149);
              local_14b = 1;
              pmVar8 = std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                       ::operator[](&(pWVar1->config).
                                     super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                    ,&local_148);
              bVar3 = util::variant::operator_cast_to_bool(pmVar8);
              local_252 = 0;
              if (bVar3) {
                bVar3 = World::PKExcept(this->world,(int)this->id);
                local_252 = bVar3 ^ 0xff;
              }
              local_235 = local_252;
            }
            local_234 = local_235;
          }
          local_232 = local_234 ^ 0xff;
        }
        if ((local_14b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_148);
        }
        if ((local_14a & 1) != 0) {
          std::allocator<char>::~allocator(&local_149);
        }
        if ((local_232 & 1) != 0) {
          local_150 = 1;
          piVar9 = std::min<int>(&local_f8,&local_150);
          local_f8 = *piVar9;
        }
        _hpgain->hp = _hpgain->hp + local_f8;
        pWVar1 = this->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"LimitDamage",&local_171);
        pmVar8 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar1->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_170);
        bVar3 = util::variant::operator_cast_to_bool(pmVar8);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator(&local_171);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          piVar9 = std::min<int>(&_hpgain->hp,&_hpgain->maxhp);
          _hpgain->hp = *piVar9;
        }
        PacketBuilder::AddByte((PacketBuilder *)&__range1,0xff);
        PacketBuilder::AddByte((PacketBuilder *)&__range1,0xff);
        PacketBuilder::AddByte((PacketBuilder *)&__range1,0xff);
        PacketBuilder::AddByte((PacketBuilder *)&__range1,0xff);
        PacketBuilder::AddByte((PacketBuilder *)&__range1,0xff);
        iVar5 = Character::PlayerID(_hpgain);
        PacketBuilder::AddShort((PacketBuilder *)&__range1,iVar5);
        local_178 = (int)(((double)_hpgain->hp / (double)_hpgain->maxhp) * 100.0);
        __range2._4_4_ = 0;
        __range2._0_4_ = 100;
        iVar5 = util::clamp<int>(&local_178,(int *)((long)&__range2 + 4),(int *)&__range2);
        PacketBuilder::AddChar((PacketBuilder *)&__range1,iVar5);
        PacketBuilder::AddShort((PacketBuilder *)&__range1,_hpgain->hp);
        __end2 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin
                           (&this->characters);
        character = (Character *)
                    std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end
                              (&this->characters);
        while (bVar3 = std::operator!=(&__end2,(_Self *)&character), bVar3) {
          ppCVar10 = std::_List_iterator<Character_*>::operator*(&__end2);
          local_1a0 = *ppCVar10;
          bVar3 = Character::InRange(_hpgain,local_1a0);
          if (bVar3) {
            std::set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_>::insert
                      ((set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> *)
                       &builder.add_size,&local_1a0);
          }
          std::_List_iterator<Character_*>::operator++(&__end2);
        }
      }
      __gnu_cxx::
      __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
      operator++(&__end1);
    }
    __end1_1 = std::set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_>::begin
                         ((set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> *)
                          &builder.add_size);
    character_1 = (Character *)
                  std::set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_>::end
                            ((set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_>
                              *)&builder.add_size);
    while (bVar3 = std::operator!=(&__end1_1,(_Self *)&character_1), bVar3) {
      ppCVar11 = std::_Rb_tree_const_iterator<Character_*>::operator*(&__end1_1);
      Character::Send(*ppCVar11,(PacketBuilder *)&__range1);
      std::_Rb_tree_const_iterator<Character_*>::operator++(&__end1_1);
    }
    PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1);
    std::set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_>::~set
              ((set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> *)
               &builder.add_size);
  }
  return;
}

Assistant:

void Map::SpellGroup(Character *from, unsigned short spell_id)
{
	const ESF_Data& spell = from->world->esf->Get(spell_id);

	if (!spell || spell.type != ESF::Heal || !from->party || from->tp < spell.tp)
		return;

	from->tp -= spell.tp;

	int displayhp = spell.hp;

	if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
	{
		displayhp = std::min(displayhp, 1);
	}

	std::set<Character *> in_range;

	PacketBuilder builder(PACKET_SPELL, PACKET_TARGET_GROUP, 8 + from->party->members.size() * 10);
	builder.AddShort(spell_id);
	builder.AddShort(from->PlayerID());
	builder.AddShort(from->tp);
	builder.AddShort(displayhp);

	UTIL_FOREACH(from->party->members, member)
	{
		if (member->map != from->map)
			continue;

		int displayhp = spell.hp;
		int hpgain = spell.hp;

		if (this->world->config["LimitDamage"])
			hpgain = std::min(hpgain, member->maxhp - member->hp);

		hpgain = std::max(hpgain, 0);

		if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
			hpgain = std::min(hpgain, 1);

		member->hp += hpgain;

		if (!this->world->config["LimitDamage"])
			member->hp = std::min(member->hp, member->maxhp);

		// wat?
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);

		builder.AddShort(member->PlayerID());
		builder.AddChar(util::clamp<int>(double(member->hp) / double(member->maxhp) * 100.0, 0, 100));
		builder.AddShort(member->hp);

		UTIL_FOREACH(this->characters, character)
		{
			if (member->InRange(character))
				in_range.insert(character);
		}
	}

	UTIL_FOREACH(in_range, character)
	{
		character->Send(builder);
	}
}